

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O0

void get_mv_candidate_from_tpl
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int ref,cand_mv_t *cand,int *cand_count
               ,int *total_cand_weight)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  short sVar9;
  bool bVar10;
  bool bVar11;
  BLOCK_SIZE BVar12;
  short sVar13;
  int iVar14;
  int iVar15;
  int in_ECX;
  byte in_DL;
  long in_RSI;
  long *in_RDI;
  void *in_R8;
  int *in_R9;
  int m;
  int unique;
  FULLPEL_MV fmv;
  int_mv mv;
  int l;
  int k;
  int valid;
  int start;
  int of_w;
  int of_h;
  int nh;
  int nw;
  int tplh;
  int tplw;
  BLOCK_SIZE tpl_bsize;
  int mi_col;
  int mi_row;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  SuperBlockEnc *sb_enc;
  int local_84;
  short local_78;
  short sStack_76;
  int local_74;
  int local_70;
  
  if (*(int *)(in_RSI + 0x15254) != 0) {
    iVar5 = *(int *)(in_RSI + 0x1a0);
    iVar6 = *(int *)(in_RSI + 0x1a4);
    BVar12 = convert_length_to_bsize((uint)*(byte *)(*in_RDI + 0xd2ad));
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar12];
    bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar12];
    iVar14 = (int)((ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                          [in_DL] / (ulong)(long)(int)(uint)bVar1);
    iVar15 = (int)((ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [in_DL] / (ulong)(long)(int)(uint)bVar2);
    if ((iVar14 != 0) && (iVar15 != 0)) {
      bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
              [*(byte *)(in_RDI[0x8401] + 0x1c)];
      bVar4 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [*(byte *)(in_RDI[0x8401] + 0x1c)];
      iVar7 = *(int *)(in_RSI + 0x15d58);
      bVar10 = true;
      *(int *)((long)in_R8 + 4) = iVar14 * iVar15;
      for (local_70 = 0; local_70 < iVar15; local_70 = local_70 + 1) {
        for (local_74 = 0; local_74 < iVar14; local_74 = local_74 + 1) {
          iVar8 = *(int *)(in_RSI + 0x15658 +
                           (long)(((iVar5 % (int)(uint)bVar3) / (int)(uint)bVar2) * iVar7 +
                                  (iVar6 % (int)(uint)bVar4) / (int)(uint)bVar1 +
                                  local_70 * *(int *)(in_RSI + 0x15d58) + local_74) * 0x1c +
                          (long)(in_ECX + -1) * 4);
          if (iVar8 == -0x7fff8000) {
            bVar10 = false;
            break;
          }
          local_78 = (short)iVar8;
          sVar9 = (short)((int)(local_78 + 3 + (uint)(-1 < local_78)) >> 3);
          sStack_76 = (short)((uint)iVar8 >> 0x10);
          sVar13 = (short)((int)(sStack_76 + 3 + (uint)(-1 < iVar8)) >> 3);
          bVar11 = true;
          for (local_84 = 0; local_84 < *in_R9; local_84 = local_84 + 1) {
            if (((int)(sVar9 + 3 + (uint)(-1 < sVar9)) >> 3 ==
                 (int)(*(short *)((long)in_R8 + (long)local_84 * 8) + 3 +
                      (uint)(-1 < *(short *)((long)in_R8 + (long)local_84 * 8))) >> 3) &&
               ((int)(sVar13 + 3 + (uint)(-1 < sVar13)) >> 3 ==
                (int)(*(short *)((long)in_R8 + (long)local_84 * 8 + 2) + 3 +
                     (uint)(-1 < *(short *)((long)in_R8 + (long)local_84 * 8 + 2))) >> 3)) {
              bVar11 = false;
              *(int *)((long)in_R8 + (long)local_84 * 8 + 4) =
                   *(int *)((long)in_R8 + (long)local_84 * 8 + 4) + 1;
              break;
            }
          }
          if (bVar11) {
            *(uint *)((long)in_R8 + (long)*in_R9 * 8) = CONCAT22(sVar13,sVar9);
            *(undefined4 *)((long)in_R8 + (long)*in_R9 * 8 + 4) = 1;
            *in_R9 = *in_R9 + 1;
          }
        }
        if (!bVar10) break;
      }
      if ((bVar10) && (*_unique = iVar15 * 2 * iVar14, 2 < *in_R9)) {
        qsort(in_R8,(long)*in_R9,8,compare_weight);
      }
    }
  }
  return;
}

Assistant:

static inline void get_mv_candidate_from_tpl(const AV1_COMP *const cpi,
                                             const MACROBLOCK *x,
                                             BLOCK_SIZE bsize, int ref,
                                             cand_mv_t *cand, int *cand_count,
                                             int *total_cand_weight) {
  const SuperBlockEnc *sb_enc = &x->sb_enc;
  if (!sb_enc->tpl_data_count) {
    return;
  }

  const AV1_COMMON *cm = &cpi->common;
  const MACROBLOCKD *xd = &x->e_mbd;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  const BLOCK_SIZE tpl_bsize =
      convert_length_to_bsize(cpi->ppi->tpl_data.tpl_bsize_1d);
  const int tplw = mi_size_wide[tpl_bsize];
  const int tplh = mi_size_high[tpl_bsize];
  const int nw = mi_size_wide[bsize] / tplw;
  const int nh = mi_size_high[bsize] / tplh;

  if (nw >= 1 && nh >= 1) {
    const int of_h = mi_row % mi_size_high[cm->seq_params->sb_size];
    const int of_w = mi_col % mi_size_wide[cm->seq_params->sb_size];
    const int start = of_h / tplh * sb_enc->tpl_stride + of_w / tplw;
    int valid = 1;

    // Assign large weight to start_mv, so it is always tested.
    cand[0].weight = nw * nh;

    for (int k = 0; k < nh; k++) {
      for (int l = 0; l < nw; l++) {
        const int_mv mv =
            sb_enc
                ->tpl_mv[start + k * sb_enc->tpl_stride + l][ref - LAST_FRAME];
        if (mv.as_int == INVALID_MV) {
          valid = 0;
          break;
        }

        const FULLPEL_MV fmv = { GET_MV_RAWPEL(mv.as_mv.row),
                                 GET_MV_RAWPEL(mv.as_mv.col) };
        int unique = 1;
        for (int m = 0; m < *cand_count; m++) {
          if (RIGHT_SHIFT_MV(fmv.row) ==
                  RIGHT_SHIFT_MV(cand[m].fmv.as_fullmv.row) &&
              RIGHT_SHIFT_MV(fmv.col) ==
                  RIGHT_SHIFT_MV(cand[m].fmv.as_fullmv.col)) {
            unique = 0;
            cand[m].weight++;
            break;
          }
        }

        if (unique) {
          cand[*cand_count].fmv.as_fullmv = fmv;
          cand[*cand_count].weight = 1;
          (*cand_count)++;
        }
      }
      if (!valid) break;
    }

    if (valid) {
      *total_cand_weight = 2 * nh * nw;
      if (*cand_count > 2)
        qsort(cand, *cand_count, sizeof(cand[0]), &compare_weight);
    }
  }
}